

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TapBranch *leaf_branch)

{
  bool bVar1;
  uint8_t uVar2;
  CfdException *pCVar3;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_118;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_100;
  Script local_e8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  uint8_t local_81;
  CfdSourceLocation local_80;
  undefined1 local_62;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_30;
  TapBranch *local_18;
  TapBranch *leaf_branch_local;
  TaprootScriptTree *this_local;
  
  local_18 = leaf_branch;
  leaf_branch_local = &this->super_TapBranch;
  TapBranch::TapBranch(&this->super_TapBranch,leaf_branch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00896638;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&this->nodes_);
  bVar1 = TapBranch::HasTapLeaf(local_18);
  if (!bVar1) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_taproot.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x1d8;
    local_30.funcname = "TaprootScriptTree";
    logger::warn<>(&local_30,"object is not tapleaf.");
    local_62 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"object is not tapleaf.",&local_61);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_60);
    local_62 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar2 = TapBranch::GetLeafVersion(local_18);
  bVar1 = TaprootUtil::IsValidLeafVersion(uVar2);
  if (!bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_taproot.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x1de;
    local_80.funcname = "TaprootScriptTree";
    local_81 = TapBranch::GetLeafVersion(local_18);
    logger::warn<unsigned_char>(&local_80,"Unsupported leaf version. [{}]",&local_81);
    local_aa = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a8,"Unsupported leaf version.",&local_a9);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_a8);
    local_aa = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (this->super_TapBranch).has_leaf_ = true;
  uVar2 = TapBranch::GetLeafVersion(local_18);
  (this->super_TapBranch).leaf_version_ = uVar2;
  TapBranch::GetScript(&local_e8,local_18);
  Script::operator=(&(this->super_TapBranch).script_,&local_e8);
  Script::~Script(&local_e8);
  TapBranch::GetBranchList(&local_100,local_18);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
            (&(this->super_TapBranch).branch_list_,&local_100);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(&local_100);
  (*local_18->_vptr_TapBranch[4])(&local_118);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
            (&this->nodes_,&local_118);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_118);
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TapBranch& leaf_branch)
    : TapBranch(leaf_branch) {
  if (!leaf_branch.HasTapLeaf()) {
    warn(CFD_LOG_SOURCE, "object is not tapleaf.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "object is not tapleaf.");
  }
  if (!TaprootUtil::IsValidLeafVersion(leaf_branch.GetLeafVersion())) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        leaf_branch.GetLeafVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = true;
  leaf_version_ = leaf_branch.GetLeafVersion();
  script_ = leaf_branch.GetScript();
  branch_list_ = leaf_branch.GetBranchList();
  nodes_ = leaf_branch.GetNodeList();
}